

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

pair<bool,_unsigned_long> __thiscall
IntegerTokenizerRule::tryMatch(IntegerTokenizerRule *this,shared_ptr<Readable> *reader)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  unsigned_long extraout_RAX;
  unsigned_long extraout_RAX_00;
  pair<bool,_unsigned_long> pVar5;
  int local_54;
  bool local_4d;
  pair<bool,_int> local_4c;
  bool local_41;
  int local_40;
  bool local_39;
  pair<bool,_int> local_38;
  unsigned_long local_30;
  size_t i;
  shared_ptr<Readable> *reader_local;
  IntegerTokenizerRule *this_local;
  unsigned_long local_10;
  unsigned_long uVar4;
  
  local_30 = 0;
  i = (size_t)reader;
  reader_local = (shared_ptr<Readable> *)this;
  peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      reader);
  iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
  if ((char)iVar2 == '0') {
    local_39 = true;
    local_40 = 1;
    local_38 = std::make_pair<bool,int>(&local_39,&local_40);
    std::pair<bool,_unsigned_long>::pair<bool,_int,_true>
              ((pair<bool,_unsigned_long> *)&this_local,&local_38);
    uVar4 = extraout_RAX;
  }
  else {
    peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        reader);
    iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
    if ('0' < (char)iVar2) {
      peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )reader);
      iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
      if ((char)iVar2 < ':') {
        do {
          local_30 = local_30 + 1;
          peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)reader);
          iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
          bVar1 = isNumeric((char)iVar2);
        } while (bVar1);
        local_41 = true;
        pVar5 = std::make_pair<bool,unsigned_long&>(&local_41,&local_30);
        uVar4 = pVar5.second;
        this_local._0_1_ = pVar5.first;
        local_10 = uVar4;
        goto LAB_0013833d;
      }
    }
    local_4d = false;
    local_54 = 0;
    local_4c = std::make_pair<bool,int>(&local_4d,&local_54);
    std::pair<bool,_unsigned_long>::pair<bool,_int,_true>
              ((pair<bool,_unsigned_long> *)&this_local,&local_4c);
    uVar4 = extraout_RAX_00;
  }
LAB_0013833d:
  pVar5._1_7_ = (undefined7)(uVar4 >> 8);
  pVar5.first = (bool)this_local._0_1_;
  pVar5.second = local_10;
  return pVar5;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (reader->charAt(i) == '0') {
      return std::make_pair(true, 1);
    }

    if ('1' <= reader->charAt(i) && reader->charAt(i) <= '9') {
      i++;
      while (isNumeric(reader->charAt(i))) {
        i++;
      }

      return std::make_pair(true, i);
    }

    return std::make_pair(false, 0);
  }